

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandLeak2Area(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__s;
  char *pcVar4;
  size_t __size;
  float fVar5;
  double dVar6;
  float local_40;
  float local_3c;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_40 = 1.0;
  local_3c = 1.0;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"ABvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) {
      if ((SC_Lib *)pAbc->pLibScl != (SC_Lib *)0x0) {
        Abc_SclConvertLeakageIntoArea((SC_Lib *)pAbc->pLibScl,local_40,local_3c);
        return 0;
      }
      __s = (FILE *)pAbc->Err;
      pcVar4 = "There is no Liberty library available.\n";
      __size = 0x27;
      goto LAB_003d5601;
    }
    if (iVar3 == 0x42) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-B\" should be followed by a floating point number.\n";
        goto LAB_003d554f;
      }
      dVar6 = atof(argv[globalUtilOptind]);
      fVar5 = (float)dVar6;
      local_3c = fVar5;
    }
    else {
      if (iVar3 != 0x41) goto LAB_003d5560;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by a floating point number.\n";
LAB_003d554f:
        Abc_Print(-1,pcVar4);
        goto LAB_003d5560;
      }
      dVar6 = atof(argv[globalUtilOptind]);
      fVar5 = (float)dVar6;
      local_40 = fVar5;
    }
    globalUtilOptind = iVar2 + 1;
    if (fVar5 <= 0.0) {
LAB_003d5560:
      fwrite("usage: leak2area [-AB float] [-v]\n",0x22,1,(FILE *)pAbc->Err);
      fwrite("\t           converts leakage into area: Area = A * Area + B * Leakage\n",0x46,1,
             (FILE *)pAbc->Err);
      fprintf((FILE *)pAbc->Err,
              "\t-A float : the multiplicative coefficient to transform area [default = %.2f]\n",
              (double)local_40);
      fprintf((FILE *)pAbc->Err,
              "\t-B float : the multiplicative coefficient to transform leakage [default = %.2f]\n",
              (double)local_3c);
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
              pcVar4);
      __s = (FILE *)pAbc->Err;
      pcVar4 = "\t-h       : print the help massage\n";
      __size = 0x23;
LAB_003d5601:
      fwrite(pcVar4,__size,1,__s);
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandLeak2Area( Abc_Frame_t * pAbc, int argc, char **argv )
{
    float A = 1, B = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ABvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a floating point number.\n" );
                goto usage;
            }
            A = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( A <= 0.0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a floating point number.\n" );
                goto usage;
            }
            B = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( B <= 0.0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }
    // update the current library
    Abc_SclConvertLeakageIntoArea( (SC_Lib *)pAbc->pLibScl, A, B );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: leak2area [-AB float] [-v]\n" );
    fprintf( pAbc->Err, "\t           converts leakage into area: Area = A * Area + B * Leakage\n" );
    fprintf( pAbc->Err, "\t-A float : the multiplicative coefficient to transform area [default = %.2f]\n", A );
    fprintf( pAbc->Err, "\t-B float : the multiplicative coefficient to transform leakage [default = %.2f]\n", B );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    return 1;
}